

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

TapBranch * __thiscall
cfd::core::DescriptorNode::GetTapBranch
          (TapBranch *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
  *this_00;
  reference __args;
  iterator iVar2;
  iterator iVar3;
  reference __k;
  string *psVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff6c8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *this_01;
  undefined5 in_stack_fffffffffffff6d0;
  undefined1 in_stack_fffffffffffff6d5;
  undefined1 in_stack_fffffffffffff6d6;
  undefined1 in_stack_fffffffffffff6d7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6d8;
  string *in_stack_fffffffffffff6e0;
  pointer in_stack_fffffffffffff718;
  TapBranch local_8d0;
  TapBranch local_858;
  undefined1 local_7d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7d8;
  size_type offset;
  string local_7b0 [32];
  string local_790 [32];
  undefined1 local_770 [8];
  Script script;
  DescriptorScriptReference obj;
  string local_3d0;
  undefined1 local_3b0 [8];
  DescriptorKeyReference ref;
  mapped_type *node_ref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *script_str;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  Script first_script;
  string target;
  string desc;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>
  *tree_node;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  key_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *array_argument_local;
  DescriptorNode *this_local;
  TapBranch *tree;
  
  key_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)array_argument;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x41668c);
  this_00 = &this->tree_node_;
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
           ::begin(this_00);
  tree_node = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>
               *)::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
                 ::end(this_00);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&tree_node), bVar1) {
    __args = ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>
             ::operator*(&__end2);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
               &__args->first);
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>
    ::operator++(&__end2);
  }
  iVar2 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(in_stack_fffffffffffff6c8);
  iVar3 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(in_stack_fffffffffffff6c8);
  ::std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>
            (iVar2._M_current,iVar3._M_current);
  ::std::__cxx11::string::string
            ((string *)(target.field_2._M_local_buf + 8),(string *)&this->value_);
  ::std::__cxx11::string::string
            ((string *)
             &first_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Script::Script((Script *)&__range2_1);
  __end2_1 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_fffffffffffff6c8);
  script_str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_fffffffffffff6c8);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&script_str), bVar1) {
    __k = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2_1);
    ref.argument_.field_2._8_8_ =
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
         ::at(&this->tree_node_,__k);
    if (((mapped_type *)ref.argument_.field_2._8_8_)->node_type_ == kDescriptorTypeKey) {
      GetKeyReferences((DescriptorKeyReference *)local_3b0,
                       (DescriptorNode *)ref.argument_.field_2._8_8_,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)key_list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      DescriptorKeyReference::GetSchnorrPubkey
                ((SchnorrPubkey *)
                 &obj.addr_prefixes_.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (DescriptorKeyReference *)local_3b0);
      SchnorrPubkey::GetHex_abi_cxx11_
                (&local_3d0,
                 (SchnorrPubkey *)
                 &obj.addr_prefixes_.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::operator=
                ((string *)
                 &first_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_3d0);
      ::std::__cxx11::string::~string((string *)&local_3d0);
      SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x41687d);
      DescriptorKeyReference::~DescriptorKeyReference
                ((DescriptorKeyReference *)
                 CONCAT17(in_stack_fffffffffffff6d7,
                          CONCAT16(in_stack_fffffffffffff6d6,
                                   CONCAT15(in_stack_fffffffffffff6d5,in_stack_fffffffffffff6d0))));
    }
    else {
      GetReference((DescriptorScriptReference *)
                   &script.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (DescriptorNode *)ref.argument_.field_2._8_8_,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)key_list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(DescriptorNode *)0x0);
      bVar1 = DescriptorScriptReference::HasRedeemScript
                        ((DescriptorScriptReference *)
                         &script.script_stack_.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        DescriptorScriptReference::GetRedeemScript
                  ((Script *)local_770,
                   (DescriptorScriptReference *)
                   &script.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        DescriptorScriptReference::GetLockingScript
                  ((Script *)local_770,
                   (DescriptorScriptReference *)
                   &script.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      bVar1 = Script::IsEmpty((Script *)&__range2_1);
      if (bVar1) {
        Script::operator=((Script *)&__range2_1,(Script *)local_770);
      }
      Script::GetHex_abi_cxx11_((string *)&offset,(Script *)local_770);
      ::std::operator+((char *)in_stack_fffffffffffff718,&this->name_);
      ::std::operator+(in_stack_fffffffffffff6d8,
                       (char *)CONCAT17(in_stack_fffffffffffff6d7,
                                        CONCAT16(in_stack_fffffffffffff6d6,
                                                 CONCAT15(in_stack_fffffffffffff6d5,
                                                          in_stack_fffffffffffff6d0))));
      ::std::__cxx11::string::operator=
                ((string *)
                 &first_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,local_790);
      ::std::__cxx11::string::~string(local_790);
      ::std::__cxx11::string::~string(local_7b0);
      ::std::__cxx11::string::~string((string *)&offset);
      Script::~Script((Script *)
                      CONCAT17(in_stack_fffffffffffff6d7,
                               CONCAT16(in_stack_fffffffffffff6d6,
                                        CONCAT15(in_stack_fffffffffffff6d5,in_stack_fffffffffffff6d0
                                                ))));
      DescriptorScriptReference::~DescriptorScriptReference
                ((DescriptorScriptReference *)
                 CONCAT17(in_stack_fffffffffffff6d7,
                          CONCAT16(in_stack_fffffffffffff6d6,
                                   CONCAT15(in_stack_fffffffffffff6d5,in_stack_fffffffffffff6d0))));
    }
    bVar1 = ::std::operator!=(__k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&first_script.script_stack_.
                                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      local_7d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::std::__cxx11::string::find
                            ((string *)(target.field_2._M_local_buf + 8),(ulong)__k);
      while (local_7d8 !=
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
            ) {
        in_stack_fffffffffffff6d8 = local_7d8;
        psVar4 = (string *)::std::__cxx11::string::length();
        in_stack_fffffffffffff6e0 =
             (string *)
             ::std::__cxx11::string::replace
                       ((ulong)((long)&target.field_2 + 8),(ulong)in_stack_fffffffffffff6d8,psVar4);
        ::std::__cxx11::string::operator=
                  ((string *)(target.field_2._M_local_buf + 8),in_stack_fffffffffffff6e0);
        local_7d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ::std::__cxx11::string::find
                              ((string *)(target.field_2._M_local_buf + 8),(ulong)__k);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2_1);
  }
  local_7d9 = 0;
  TapBranch::TapBranch(__return_storage_ptr__);
  uVar5 = ::std::__cxx11::string::empty();
  if (((uVar5 & 1) == 0) &&
     (in_stack_fffffffffffff6d7 =
           ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff6d7,
                                      CONCAT16(in_stack_fffffffffffff6d6,
                                               CONCAT15(in_stack_fffffffffffff6d5,
                                                        in_stack_fffffffffffff6d0))),
                             (char *)in_stack_fffffffffffff6c8), !(bool)in_stack_fffffffffffff6d7))
  {
    TapBranch::FromString(&local_858,(string *)((long)&target.field_2 + 8));
    TapBranch::operator=(__return_storage_ptr__,&local_858);
    TapBranch::~TapBranch
              ((TapBranch *)
               CONCAT17(in_stack_fffffffffffff6d7,
                        CONCAT16(in_stack_fffffffffffff6d6,
                                 CONCAT15(in_stack_fffffffffffff6d5,in_stack_fffffffffffff6d0))));
    in_stack_fffffffffffff6d6 = TapBranch::HasTapLeaf(__return_storage_ptr__);
    if ((!(bool)in_stack_fffffffffffff6d6) &&
       (in_stack_fffffffffffff6d5 = Script::IsEmpty((Script *)&__range2_1),
       !(bool)in_stack_fffffffffffff6d5)) {
      this_01 = (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                &stack0xfffffffffffff718;
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
                (this_01);
      TapBranch::ChangeTapLeaf(&local_8d0,__return_storage_ptr__,(Script *)&__range2_1,this_01);
      TapBranch::operator=(__return_storage_ptr__,&local_8d0);
      TapBranch::~TapBranch
                ((TapBranch *)
                 CONCAT17(in_stack_fffffffffffff6d7,
                          CONCAT16(in_stack_fffffffffffff6d6,
                                   CONCAT15(in_stack_fffffffffffff6d5,in_stack_fffffffffffff6d0))));
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 in_stack_fffffffffffff6e0);
    }
  }
  local_7d9 = 1;
  Script::~Script((Script *)
                  CONCAT17(in_stack_fffffffffffff6d7,
                           CONCAT16(in_stack_fffffffffffff6d6,
                                    CONCAT15(in_stack_fffffffffffff6d5,in_stack_fffffffffffff6d0))))
  ;
  ::std::__cxx11::string::~string
            ((string *)
             &first_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::__cxx11::string::~string((string *)(target.field_2._M_local_buf + 8));
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff6e0);
  return __return_storage_ptr__;
}

Assistant:

TapBranch DescriptorNode::GetTapBranch(
    std::vector<std::string>* array_argument) const {
  static auto sort_func = [](const std::string& src, const std::string& dest) {
    return src.length() > dest.length();
  };
  std::vector<std::string> key_list;
  for (const auto& tree_node : tree_node_) {
    key_list.emplace_back(tree_node.first);
  }
  std::sort(key_list.begin(), key_list.end(), sort_func);

  std::string desc = value_;
  std::string target;
  Script first_script;
  for (const auto& script_str : key_list) {
    const auto& node_ref = tree_node_.at(script_str);
    if (node_ref.node_type_ == DescriptorNodeType::kDescriptorTypeKey) {
      auto ref = node_ref.GetKeyReferences(array_argument);
      target = ref.GetSchnorrPubkey().GetHex();
    } else {
      const auto obj = node_ref.GetReference(array_argument);
      Script script = obj.HasRedeemScript() ? obj.GetRedeemScript()
                                            : obj.GetLockingScript();
      if (first_script.IsEmpty()) first_script = script;
      target = "tl(" + script.GetHex() + ")";
    }
    if (script_str != target) {
      auto offset = desc.find(script_str);
      while (offset != std::string::npos) {
        desc = desc.replace(offset, script_str.length(), target);
        offset = desc.find(script_str);
      }
    }
  }

  TapBranch tree;
  if (desc.empty() || (desc == "{}")) {
    // do nothing
  } else {
    tree = TapBranch::FromString(desc);
    if ((!tree.HasTapLeaf()) && (!first_script.IsEmpty())) {
      tree = tree.ChangeTapLeaf(first_script);
    }
  }
  return tree;
}